

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
           *this)

{
  CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *alloc;
  char *pcVar1;
  byte *pbVar2;
  ctrl_t *pcVar3;
  proxy *ppVar4;
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined8 uVar21;
  int iVar22;
  ctrl_t *pcVar23;
  undefined4 extraout_var;
  size_t i;
  ulong uVar25;
  ulong uVar26;
  byte bVar27;
  size_t i_00;
  FindInfo FVar28;
  slot_type sStack_40;
  ulong uVar24;
  
  uVar24 = this->capacity_;
  if (uVar24 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar24 + 1 & uVar24) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x288,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar24 - (uVar24 >> 3) >> 1 < this->size_) {
    resize(this,uVar24 * 2 + 1);
    return;
  }
  uVar24 = this->capacity_;
  if ((uVar24 == 0) || ((uVar24 + 1 & uVar24) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                 );
  }
  if (uVar24 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                 );
  }
  pcVar3 = this->ctrl_;
  if (pcVar3[uVar24] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar23 = pcVar3 + uVar24;
  if (pcVar23 + 1 != pcVar3) {
    uVar26 = 0;
    do {
      pcVar1 = pcVar3 + uVar26;
      cVar6 = pcVar1[1];
      cVar7 = pcVar1[2];
      cVar8 = pcVar1[3];
      cVar9 = pcVar1[4];
      cVar10 = pcVar1[5];
      cVar11 = pcVar1[6];
      cVar12 = pcVar1[7];
      cVar13 = pcVar1[8];
      cVar14 = pcVar1[9];
      cVar15 = pcVar1[10];
      cVar16 = pcVar1[0xb];
      cVar17 = pcVar1[0xc];
      cVar18 = pcVar1[0xd];
      cVar19 = pcVar1[0xe];
      cVar20 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar3 + uVar26);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar6 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      uVar26 = uVar26 + 0x10;
    } while (uVar24 + 1 != uVar26);
  }
  uVar21 = *(undefined8 *)(pcVar3 + 8);
  *(undefined8 *)(pcVar23 + 1) = *(undefined8 *)pcVar3;
  *(undefined8 *)(pcVar23 + 9) = uVar21;
  *pcVar23 = -1;
  if (this->capacity_ == 0) {
    i_00 = 0;
  }
  else {
    alloc = &this->settings_;
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        ppVar4 = this->slots_[i_00].value.first.mDat;
        if (ppVar4 == (proxy *)0x0) {
          uVar24 = 0;
        }
        else {
          iVar22 = (*ppVar4->data->_vptr_baseHolder[7])();
          uVar24 = CONCAT44(extraout_var,iVar22);
        }
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar24;
        uVar26 = SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar28 = find_first_non_full(this,uVar26);
        i = FVar28.offset;
        uVar24 = this->capacity_;
        if ((uVar24 + 1 & uVar24) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar25 = uVar26 >> 7 & uVar24;
        bVar27 = (byte)uVar26;
        if (((i_00 - uVar25 ^ i - uVar25) & uVar24) < 0x10) {
          bVar27 = bVar27 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar27 & 0x7f);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
            transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)alloc,&sStack_40,
                       this->slots_ + i_00);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
            transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)alloc,
                       this->slots_ + i_00,this->slots_ + i);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
            transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)alloc,
                       this->slots_ + i,&sStack_40);
            i_00 = i_00 - 1;
            goto LAB_0013db51;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs_impl::any>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs_impl::any>>]"
                         );
          }
          set_ctrl(this,i,bVar27 & 0x7f);
          hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
          transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                    ((allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *)alloc,
                     this->slots_ + i,this->slots_ + i_00);
          bVar27 = 0x80;
        }
        set_ctrl(this,i_00,bVar27);
      }
LAB_0013db51:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this,i_00);
  return;
}

Assistant:

void rehash_and_grow_if_necessary()
			{
				if (capacity_ == 0) {
					resize(1);
				}
				else if (size() <= CapacityToGrowth(capacity()) / 2) {
					// Squash DELETED without growing if there is enough capacity.
					drop_deletes_without_resize();
				}
				else {
					// Otherwise grow the container.
					resize(capacity_ * 2 + 1);
				}
			}